

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O3

void printMemOperand(MCInst *MI,int opNum,SStream *O,char *Modifier)

{
  uint8_t *puVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  MCOperand *op;
  int64_t iVar5;
  
  set_mem_access(MI,true);
  printOperand(MI,opNum,O);
  if (Modifier == (char *)0x0) {
LAB_001bc24e:
    op = MCInst_getOperand(MI,opNum + 1);
    _Var2 = MCOperand_isReg(op);
    if (_Var2) {
      uVar4 = MCOperand_getReg(op);
      if (uVar4 == 0x47) goto LAB_001bc2be;
    }
    _Var2 = MCOperand_isImm(op);
    if (_Var2) {
      iVar5 = MCOperand_getImm(op);
      if (iVar5 == 0) goto LAB_001bc2be;
    }
    SStream_concat0(O,"+");
  }
  else {
    iVar3 = strcmp(Modifier,"arith");
    if (iVar3 != 0) goto LAB_001bc24e;
    SStream_concat0(O,", ");
  }
  printOperand(MI,opNum + 1,O);
LAB_001bc2be:
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
    puVar1 = &(MI->flat_insn->detail->field_6).x86.rex;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printMemOperand(MCInst *MI, int opNum, SStream *O, const char *Modifier)
{
	MCOperand *MO;

	set_mem_access(MI, true);
	printOperand(MI, opNum, O);

	// If this is an ADD operand, emit it like normal operands.
	if (Modifier && !strcmp(Modifier, "arith")) {
		SStream_concat0(O, ", ");
		printOperand(MI, opNum + 1, O);
		set_mem_access(MI, false);
		return;
	}

	MO = MCInst_getOperand(MI, opNum + 1);

	if (MCOperand_isReg(MO) && (MCOperand_getReg(MO) == SP_G0)) {
		set_mem_access(MI, false);
		return;   // don't print "+%g0"
	}

	if (MCOperand_isImm(MO) && (MCOperand_getImm(MO) == 0)) {
		set_mem_access(MI, false);
		return;   // don't print "+0"
	}

	SStream_concat0(O, "+");	// qq

	printOperand(MI, opNum + 1, O);
	set_mem_access(MI, false);
}